

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O2

uint sad_w64_avg_avx2(uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,int h,
                     uint8_t *second_pred,int second_pred_stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [32];
  undefined4 in_register_00000084;
  undefined1 (*pauVar5) [32];
  int iVar6;
  bool bVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [32];
  
  pauVar5 = (undefined1 (*) [32])(CONCAT44(in_register_00000084,h) + 0x20);
  pauVar3 = (undefined1 (*) [32])(ref_ptr + 0x20);
  pauVar4 = (undefined1 (*) [32])(src_ptr + 0x20);
  auVar9 = ZEXT1664((undefined1  [16])0x0);
  iVar6 = 0x40;
  while( true ) {
    bVar7 = iVar6 == 0;
    iVar6 = iVar6 + -1;
    auVar8 = auVar9._0_32_;
    if (bVar7) break;
    auVar10 = vpavgb_avx2(pauVar3[-1],pauVar5[-1]);
    auVar2 = vpavgb_avx2(*pauVar3,*pauVar5);
    auVar10 = vpsadbw_avx2(auVar10,pauVar4[-1]);
    auVar2 = vpsadbw_avx2(auVar2,*pauVar4);
    auVar8 = vpaddd_avx2(auVar10,auVar8);
    auVar8 = vpaddd_avx2(auVar8,auVar2);
    auVar9 = ZEXT3264(auVar8);
    pauVar5 = (undefined1 (*) [32])(*pauVar5 + ((ulong)second_pred & 0xffffffff));
    pauVar3 = (undefined1 (*) [32])(*pauVar3 + ref_stride);
    pauVar4 = (undefined1 (*) [32])(*pauVar4 + src_stride);
  }
  auVar10 = vpsrldq_avx2(auVar8,8);
  auVar8 = vpaddd_avx2(auVar10,auVar8);
  auVar1 = vpaddd_avx(auVar8._0_16_,auVar8._16_16_);
  return auVar1._0_4_;
}

Assistant:

static unsigned int sad_w64_avg_avx2(const uint8_t *src_ptr, int src_stride,
                                     const uint8_t *ref_ptr, int ref_stride,
                                     const int h, const uint8_t *second_pred,
                                     const int second_pred_stride) {
  int i;
  __m256i sad1_reg, sad2_reg, ref1_reg, ref2_reg;
  __m256i sum_sad = _mm256_setzero_si256();
  __m256i sum_sad_h;
  __m128i sum_sad128;
  for (i = 0; i < h; i++) {
    ref1_reg = _mm256_loadu_si256((__m256i const *)ref_ptr);
    ref2_reg = _mm256_loadu_si256((__m256i const *)(ref_ptr + 32));
    ref1_reg = _mm256_avg_epu8(
        ref1_reg, _mm256_loadu_si256((__m256i const *)second_pred));
    ref2_reg = _mm256_avg_epu8(
        ref2_reg, _mm256_loadu_si256((__m256i const *)(second_pred + 32)));
    sad1_reg =
        _mm256_sad_epu8(ref1_reg, _mm256_loadu_si256((__m256i const *)src_ptr));
    sad2_reg = _mm256_sad_epu8(
        ref2_reg, _mm256_loadu_si256((__m256i const *)(src_ptr + 32)));
    sum_sad = _mm256_add_epi32(sum_sad, _mm256_add_epi32(sad1_reg, sad2_reg));
    ref_ptr += ref_stride;
    src_ptr += src_stride;
    second_pred += second_pred_stride;
  }
  sum_sad_h = _mm256_srli_si256(sum_sad, 8);
  sum_sad = _mm256_add_epi32(sum_sad, sum_sad_h);
  sum_sad128 = _mm256_extracti128_si256(sum_sad, 1);
  sum_sad128 = _mm_add_epi32(_mm256_castsi256_si128(sum_sad), sum_sad128);
  return (unsigned int)_mm_cvtsi128_si32(sum_sad128);
}